

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_sweep(PWorker worker)

{
  long area_00;
  TArea area;
  TCoord x;
  TCoord cover;
  PCell_conflict cell;
  int yindex;
  PWorker worker_local;
  
  if (worker->num_cells != 0) {
    for (cell._4_4_ = 0; (long)cell._4_4_ < worker->ycount; cell._4_4_ = cell._4_4_ + 1) {
      cover = (TCoord)worker->ycells[cell._4_4_];
      x = 0;
      area = 0;
      for (; cover != 0; cover = *(TCoord *)(cover + 0x10)) {
        if ((area < *(int *)cover) && (x != 0)) {
          gray_hline(worker,area,(long)cell._4_4_,x << 9,*(int *)cover - (int)area);
        }
        x = *(int *)(cover + 4) + x;
        area_00 = x * 0x200 - *(long *)(cover + 8);
        if ((area_00 != 0) && (-1 < *(int *)cover)) {
          gray_hline(worker,(long)*(int *)cover,(long)cell._4_4_,area_00,1);
        }
        area = (TArea)(*(int *)cover + 1);
      }
      if ((area < worker->count_ex) && (x != 0)) {
        gray_hline(worker,area,(long)cell._4_4_,x << 9,(int)worker->count_ex - (int)area);
      }
    }
  }
  return;
}

Assistant:

static void
  gray_sweep( RAS_ARG)
  {
    int  yindex;

    if ( ras.num_cells == 0 )
      return;

    for ( yindex = 0; yindex < ras.ycount; yindex++ )
    {
      PCell   cell  = ras.ycells[yindex];
      TCoord  cover = 0;
      TCoord  x     = 0;


      for ( ; cell != NULL; cell = cell->next )
      {
        TArea  area;


        if ( cell->x > x && cover != 0 )
          gray_hline( RAS_VAR_ x, yindex, cover * ( ONE_PIXEL * 2 ),
                      cell->x - x );

        cover += cell->cover;
        area   = cover * ( ONE_PIXEL * 2 ) - cell->area;

        if ( area != 0 && cell->x >= 0 )
          gray_hline( RAS_VAR_ cell->x, yindex, area, 1 );

        x = cell->x + 1;
      }

      if ( ras.count_ex > x && cover != 0 )
        gray_hline( RAS_VAR_ x, yindex, cover * ( ONE_PIXEL * 2 ),
                    ras.count_ex - x );
    }
  }